

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_fields_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::
VisitFieldsTest_VisitedMessageFieldsCountMatchesListFields_Test::
VisitFieldsTest_VisitedMessageFieldsCountMatchesListFields_Test
          (VisitFieldsTest_VisitedMessageFieldsCountMatchesListFields_Test *this)

{
  VisitFieldsTest_VisitedMessageFieldsCountMatchesListFields_Test *this_local;
  
  VisitFieldsTest::VisitFieldsTest(&this->super_VisitFieldsTest);
  (this->super_VisitFieldsTest).
  super_TestWithParam<google::protobuf::internal::(anonymous_namespace)::TestParam>.super_Test.
  _vptr_Test = (_func_int **)
               &PTR__VisitFieldsTest_VisitedMessageFieldsCountMatchesListFields_Test_029e5928;
  (this->super_VisitFieldsTest).
  super_TestWithParam<google::protobuf::internal::(anonymous_namespace)::TestParam>.
  super_WithParamInterface<google::protobuf::internal::(anonymous_namespace)::TestParam>.
  _vptr_WithParamInterface = (_func_int **)&DAT_029e5968;
  return;
}

Assistant:

TEST_P(VisitFieldsTest, VisitedMessageFieldsCountMatchesListFields) {
  uint32_t count = 0;
  VisitFields(*message_, [&](auto info) { ++count; }, FieldMask::kMessage);

  std::vector<const FieldDescriptor*> fields;
  reflection_->ListFields(*message_, &fields);
  int message_count = 0;
  for (auto field : fields) {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) ++message_count;
  }

  EXPECT_EQ(count, message_count);
}